

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O3

FunctionInfo * __thiscall
InliningDecider::GetCallSiteFuncInfo
          (InliningDecider *this,FunctionBody *inliner,ProfileId profiledCallSiteId,
          bool *isConstructorCall,bool *isPolymorphicCall)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicProfileInfo *this_00;
  FunctionInfo *pFVar4;
  
  if (inliner == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x55,"(inliner)","inliner");
    if (!bVar2) goto LAB_0055bf32;
    *puVar3 = 0;
  }
  if (inliner->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x56,"(profiledCallSiteId < inliner->GetProfiledCallSiteCount())",
                       "profiledCallSiteId < inliner->GetProfiledCallSiteCount()");
    if (!bVar2) goto LAB_0055bf32;
    *puVar3 = 0;
  }
  this_00 = Js::FunctionBody::GetAnyDynamicProfileInfo(inliner);
  if (this_00 == (DynamicProfileInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x59,"(profileData)","profileData");
    if (!bVar2) {
LAB_0055bf32:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pFVar4 = Js::DynamicProfileInfo::GetCallSiteInfo
                     (this_00,inliner,profiledCallSiteId,isConstructorCall,isPolymorphicCall);
  return pFVar4;
}

Assistant:

Js::FunctionInfo *InliningDecider::GetCallSiteFuncInfo(Js::FunctionBody *const inliner, const Js::ProfileId profiledCallSiteId, bool* isConstructorCall, bool* isPolymorphicCall)
{
    Assert(inliner);
    Assert(profiledCallSiteId < inliner->GetProfiledCallSiteCount());

    const auto profileData = inliner->GetAnyDynamicProfileInfo();
    Assert(profileData);

    return profileData->GetCallSiteInfo(inliner, profiledCallSiteId, isConstructorCall, isPolymorphicCall);
}